

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

CNetMessage * __thiscall
V2Transport::GetReceivedMessage
          (CNetMessage *__return_storage_ptr__,V2Transport *this,microseconds time,
          bool *reject_message)

{
  long lVar1;
  size_t __n;
  bool bVar2;
  Span<const_unsigned_char> *contents_00;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  DataStream local_98;
  Span<const_unsigned_char> contents;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock49;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  msg_type;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock49,&this->m_recv_mutex,"m_recv_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
             ,0x593,false);
  if (this->m_recv_state == V1) {
    V1Transport::GetReceivedMessage(__return_storage_ptr__,&this->m_v1_fallback,time,reject_message)
    ;
  }
  else {
    contents.m_data =
         (this->m_recv_decode_buffer).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    contents.m_size =
         (long)(this->m_recv_decode_buffer).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)contents.m_data;
    GetMessageType_abi_cxx11_(&msg_type,(V2Transport *)&contents,contents_00);
    local_98.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.m_read_pos = 0;
    local_98.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    CNetMessage::CNetMessage(__return_storage_ptr__,&local_98);
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_98);
    __return_storage_ptr__->m_raw_message_size =
         (*(int *)&(this->m_recv_decode_buffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
         *(int *)&(this->m_recv_decode_buffer).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start) + 0x14;
    if (msg_type.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      *reject_message = false;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&__return_storage_ptr__->m_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg_type);
      __n = contents.m_size;
      (__return_storage_ptr__->m_time).__r = time.__r;
      __return_storage_ptr__->m_message_size = (uint32_t)contents.m_size;
      DataStream::resize(&__return_storage_ptr__->m_recv,contents.m_size,0);
      if (__n != 0) {
        memmove((__return_storage_ptr__->m_recv).vch.
                super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start + (__return_storage_ptr__->m_recv).m_read_pos,
                contents.m_data,__n);
      }
    }
    else {
      bVar2 = ::LogAcceptCategory(NET,Debug);
      if (bVar2) {
        local_98.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start =
             (this->m_recv_decode_buffer).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish +
             -(long)(this->m_recv_decode_buffer).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
        ;
        source_file._M_len = 0x57;
        logging_function._M_str = "GetReceivedMessage";
        logging_function._M_len = 0x12;
        LogPrintFormatInternal<unsigned_long,long>
                  (logging_function,source_file,0x5a4,NET,Debug,(ConstevalFormatString<2U>)0xc98957,
                   (unsigned_long *)&local_98,&this->m_nodeid);
      }
      *reject_message = true;
    }
    ClearShrink<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&this->m_recv_decode_buffer);
    this->m_recv_state = APP;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&msg_type);
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock49.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CNetMessage V2Transport::GetReceivedMessage(std::chrono::microseconds time, bool& reject_message) noexcept
{
    AssertLockNotHeld(m_recv_mutex);
    LOCK(m_recv_mutex);
    if (m_recv_state == RecvState::V1) return m_v1_fallback.GetReceivedMessage(time, reject_message);

    Assume(m_recv_state == RecvState::APP_READY);
    Span<const uint8_t> contents{m_recv_decode_buffer};
    auto msg_type = GetMessageType(contents);
    CNetMessage msg{DataStream{}};
    // Note that BIP324Cipher::EXPANSION also includes the length descriptor size.
    msg.m_raw_message_size = m_recv_decode_buffer.size() + BIP324Cipher::EXPANSION;
    if (msg_type) {
        reject_message = false;
        msg.m_type = std::move(*msg_type);
        msg.m_time = time;
        msg.m_message_size = contents.size();
        msg.m_recv.resize(contents.size());
        std::copy(contents.begin(), contents.end(), UCharCast(msg.m_recv.data()));
    } else {
        LogDebug(BCLog::NET, "V2 transport error: invalid message type (%u bytes contents), peer=%d\n", m_recv_decode_buffer.size(), m_nodeid);
        reject_message = true;
    }
    ClearShrink(m_recv_decode_buffer);
    SetReceiveState(RecvState::APP);

    return msg;
}